

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O3

void __thiscall ftxui::TerminalInputParser::Send(TerminalInputParser *this,Output output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false> _Var2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  undefined8 local_138;
  undefined8 uStack_130;
  int local_128;
  Event local_118;
  Event local_d8;
  Event local_98;
  Event local_58;
  
  switch(output.type) {
  case DROP:
    break;
  case CHARACTER:
    _Var2._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    local_158._M_dataplus._M_p = (this->pending_)._M_dataplus._M_p;
    paVar1 = &(this->pending_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == paVar1) {
      local_158.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&(this->pending_).field_2 + 8);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_158._M_string_length = (this->pending_)._M_string_length;
    (this->pending_)._M_dataplus._M_p = (pointer)paVar1;
    (this->pending_)._M_string_length = 0;
    (this->pending_).field_2._M_local_buf[0] = '\0';
    Event::Character(&local_58,&local_158);
    SenderImpl<ftxui::Event>::Send(_Var2._M_head_impl,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.input_._M_dataplus._M_p != &local_58.input_.field_2) {
      operator_delete(local_58.input_._M_dataplus._M_p,
                      local_58.input_.field_2._M_allocated_capacity + 1);
    }
    uVar3 = local_158.field_2._M_allocated_capacity;
    _Var4._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_0014b5fe:
      operator_delete(_Var4._M_p,uVar3 + 1);
    }
    break;
  case SPECIAL:
    _Var2._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    local_178._M_dataplus._M_p = (this->pending_)._M_dataplus._M_p;
    paVar1 = &(this->pending_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == paVar1) {
      local_178.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_178.field_2._8_8_ = *(undefined8 *)((long)&(this->pending_).field_2 + 8);
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_178._M_string_length = (this->pending_)._M_string_length;
    (this->pending_)._M_dataplus._M_p = (pointer)paVar1;
    (this->pending_)._M_string_length = 0;
    (this->pending_).field_2._M_local_buf[0] = '\0';
    Event::Special(&local_98,&local_178);
    SenderImpl<ftxui::Event>::Send(_Var2._M_head_impl,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.input_._M_dataplus._M_p != &local_98.input_.field_2) {
      operator_delete(local_98.input_._M_dataplus._M_p,
                      local_98.input_.field_2._M_allocated_capacity + 1);
    }
    uVar3 = local_178.field_2._M_allocated_capacity;
    _Var4._M_p = local_178._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_0014b5fe;
    break;
  case MOUSE:
    _Var2._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    local_198._M_dataplus._M_p = (this->pending_)._M_dataplus._M_p;
    paVar1 = &(this->pending_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == paVar1) {
      local_198.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_198.field_2._8_8_ = *(undefined8 *)((long)&(this->pending_).field_2 + 8);
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_198._M_string_length = (this->pending_)._M_string_length;
    (this->pending_)._M_dataplus._M_p = (pointer)paVar1;
    (this->pending_)._M_string_length = 0;
    (this->pending_).field_2._M_local_buf[0] = '\0';
    local_128 = output.field_1.mouse.y;
    local_138 = output.field_1._0_8_;
    uStack_130 = output.field_1._8_8_;
    Event::Mouse(&local_d8,&local_198,output.field_1.mouse);
    SenderImpl<ftxui::Event>::Send(_Var2._M_head_impl,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.input_._M_dataplus._M_p != &local_d8.input_.field_2) {
      operator_delete(local_d8.input_._M_dataplus._M_p,
                      local_d8.input_.field_2._M_allocated_capacity + 1);
    }
    uVar3 = local_198.field_2._M_allocated_capacity;
    _Var4._M_p = local_198._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) goto LAB_0014b5fe;
    break;
  case CURSOR_REPORTING:
    _Var2._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    local_1b8._M_dataplus._M_p = (this->pending_)._M_dataplus._M_p;
    paVar1 = &(this->pending_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == paVar1) {
      local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_1b8.field_2._8_8_ = *(undefined8 *)((long)&(this->pending_).field_2 + 8);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_1b8._M_string_length = (this->pending_)._M_string_length;
    (this->pending_)._M_dataplus._M_p = (pointer)paVar1;
    (this->pending_)._M_string_length = 0;
    (this->pending_).field_2._M_local_buf[0] = '\0';
    Event::CursorReporting(&local_118,&local_1b8,output.field_1.cursor.x,output.field_1.cursor.y);
    SenderImpl<ftxui::Event>::Send(_Var2._M_head_impl,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.input_._M_dataplus._M_p != &local_118.input_.field_2) {
      operator_delete(local_118.input_._M_dataplus._M_p,
                      local_118.input_.field_2._M_allocated_capacity + 1);
    }
    uVar3 = local_1b8.field_2._M_allocated_capacity;
    _Var4._M_p = local_1b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) goto LAB_0014b5fe;
    break;
  default:
    goto switchD_0014b2ef_default;
  }
  (this->pending_)._M_string_length = 0;
  *(this->pending_)._M_dataplus._M_p = '\0';
switchD_0014b2ef_default:
  return;
}

Assistant:

void TerminalInputParser::Send(TerminalInputParser::Output output) {
  switch (output.type) {
    case UNCOMPLETED:
      return;

    case DROP:
      pending_.clear();
      return;

    case CHARACTER:
      out_->Send(Event::Character(std::move(pending_)));
      pending_.clear();
      return;

    case SPECIAL:
      out_->Send(Event::Special(std::move(pending_)));
      pending_.clear();
      return;

    case MOUSE:
      out_->Send(Event::Mouse(std::move(pending_), output.mouse));
      pending_.clear();
      return;

    case CURSOR_REPORTING:
      out_->Send(Event::CursorReporting(std::move(pending_), output.cursor.x,
                                        output.cursor.y));
      pending_.clear();
      return;
  }
  // NOT_REACHED().
}